

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> __thiscall
opts::Option<int>(opts *this,string *l,int *var,string *help)

{
  OptionContainer<int> *this_00;
  string sStack_48;
  
  this_00 = (OptionContainer<int> *)operator_new(0x98);
  Traits<int>::type_string_abi_cxx11_();
  OptionContainer<int>::OptionContainer(this_00,'\0',l,var,help,&sStack_48);
  *(OptionContainer<int> **)this = this_00;
  std::__cxx11::string::~string((string *)&sStack_48);
  return (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<BasicOption>
Option(const std::string& l, T& var, const std::string& help)               { return std::unique_ptr<BasicOption>{new OptionContainer<T>(0, l, var, help)}; }